

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbsvolume.cpp
# Opt level: O0

bool ON_GetCageXform(ON_NurbsCage *cage,ON_Xform *cage_xform)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ON_Xform local_398;
  ON_Xform local_318;
  undefined1 local_298 [8];
  ON_Xform x3;
  ON_Xform x2;
  ON_Xform x1;
  ON_Interval d2;
  ON_Interval d1;
  ON_Interval d0;
  double dz0;
  double dy0;
  double dx0;
  ON_3dVector Z0;
  ON_3dVector Y0;
  ON_3dVector X0;
  ON_3dPoint P001;
  ON_3dPoint P010;
  ON_3dPoint P100;
  ON_3dPoint P000;
  bool rc;
  ON_Xform *cage_xform_local;
  ON_NurbsCage *cage_local;
  
  cage_local._7_1_ = false;
  memcpy(cage_xform,&ON_Xform::IdentityTransformation,0x80);
  uVar2 = (*(cage->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(cage,0);
  if ((uVar2 & 1) != 0) {
    bVar1 = ON_NurbsCage::GetCV(cage,0,0,0,(ON_3dPoint *)&P100.z);
    if (bVar1) {
      iVar3 = ON_NurbsCage::CVCount(cage,0);
      bVar1 = ON_NurbsCage::GetCV(cage,iVar3 + -1,0,0,(ON_3dPoint *)&P010.z);
      if (bVar1) {
        iVar3 = ON_NurbsCage::CVCount(cage,1);
        bVar1 = ON_NurbsCage::GetCV(cage,0,iVar3 + -1,0,(ON_3dPoint *)&P001.z);
        if (bVar1) {
          iVar3 = ON_NurbsCage::CVCount(cage,2);
          bVar1 = ON_NurbsCage::GetCV(cage,0,0,iVar3 + -1,(ON_3dPoint *)&X0.z);
          if (bVar1) {
            ON_3dPoint::operator-((ON_3dVector *)&Y0.z,(ON_3dPoint *)&P010.z,(ON_3dPoint *)&P100.z);
            ON_3dPoint::operator-((ON_3dVector *)&Z0.z,(ON_3dPoint *)&P001.z,(ON_3dPoint *)&P100.z);
            ON_3dPoint::operator-((ON_3dVector *)&dx0,(ON_3dPoint *)&X0.z,(ON_3dPoint *)&P100.z);
            dVar5 = ON_3dVector::Length((ON_3dVector *)&Y0.z);
            dVar6 = ON_3dVector::Length((ON_3dVector *)&Z0.z);
            dVar7 = ON_3dVector::Length((ON_3dVector *)&dx0);
            join_0x00001240_0x00001200_ = ON_NurbsCage::Domain(cage,0);
            join_0x00001240_0x00001200_ = ON_NurbsCage::Domain(cage,1);
            join_0x00001240_0x00001200_ = ON_NurbsCage::Domain(cage,2);
            ON_3dVector::Unitize((ON_3dVector *)&Y0.z);
            ON_3dVector::Unitize((ON_3dVector *)&Z0.z);
            ON_3dVector::Unitize((ON_3dVector *)&dx0);
            ON_Xform::ON_Xform((ON_Xform *)(x2.m_xform[3] + 3));
            ON_Xform::Rotation((ON_Xform *)(x2.m_xform[3] + 3),(ON_3dPoint *)&P100.z,
                               (ON_3dVector *)&Y0.z,(ON_3dVector *)&Z0.z,(ON_3dVector *)&dx0,
                               &ON_3dPoint::Origin,&ON_3dVector::XAxis,&ON_3dVector::YAxis,
                               &ON_3dVector::ZAxis);
            dVar8 = ON_Interval::Length((ON_Interval *)(d1.m_t + 1));
            dVar9 = ON_Interval::Length((ON_Interval *)(d2.m_t + 1));
            dVar10 = ON_Interval::Length((ON_Interval *)(x1.m_xform[3] + 3));
            ON_Xform::DiagonalTransformation
                      ((ON_Xform *)(x3.m_xform[3] + 3),dVar8 / dVar5,dVar9 / dVar6,dVar10 / dVar7);
            pdVar4 = ON_Interval::operator[]((ON_Interval *)(d1.m_t + 1),0);
            dVar5 = *pdVar4;
            pdVar4 = ON_Interval::operator[]((ON_Interval *)(d2.m_t + 1),0);
            dVar6 = *pdVar4;
            pdVar4 = ON_Interval::operator[]((ON_Interval *)(x1.m_xform[3] + 3),0);
            ON_Xform::TranslationTransformation((ON_Xform *)local_298,dVar5,dVar6,*pdVar4);
            ON_Xform::operator*(&local_398,(ON_Xform *)(x3.m_xform[3] + 3),
                                (ON_Xform *)(x2.m_xform[3] + 3));
            ON_Xform::operator*(&local_318,(ON_Xform *)local_298,&local_398);
            memcpy(cage_xform,&local_318,0x80);
            cage_local._7_1_ = true;
          }
          else {
            cage_local._7_1_ = false;
          }
        }
        else {
          cage_local._7_1_ = false;
        }
      }
      else {
        cage_local._7_1_ = false;
      }
    }
    else {
      cage_local._7_1_ = false;
    }
  }
  return cage_local._7_1_;
}

Assistant:

bool ON_GetCageXform( const ON_NurbsCage& cage, ON_Xform& cage_xform )
{
  bool rc = false;
  cage_xform = ON_Xform::IdentityTransformation;
  if ( cage.IsValid() )
  {
    ON_3dPoint P000, P100, P010, P001;
    if ( !cage.GetCV(0,0,0,P000) )
      return false;
    if ( !cage.GetCV(cage.CVCount(0)-1,0,0,P100))
      return false;
    if (!cage.GetCV(0,cage.CVCount(1)-1,0,P010))
      return false;
    if (!cage.GetCV(0,0,cage.CVCount(2)-1,P001))
      return false;

    ON_3dVector X0 = P100 - P000;
    ON_3dVector Y0 = P010 - P000;
    ON_3dVector Z0 = P001 - P000;

    double dx0 = X0.Length();
    double dy0 = Y0.Length();
    double dz0 = Z0.Length();

    ON_Interval d0 = cage.Domain(0);
    ON_Interval d1 = cage.Domain(1);
    ON_Interval d2 = cage.Domain(2);

    X0.Unitize();
    Y0.Unitize();
    Z0.Unitize();

    ON_Xform x1;
    x1.Rotation( 
      P000, X0, Y0, Z0, 
      ON_3dPoint::Origin, ON_3dVector::XAxis, ON_3dVector::YAxis, ON_3dVector::ZAxis 
      );

    const ON_Xform x2(ON_Xform::DiagonalTransformation( d0.Length()/dx0, d1.Length()/dy0, d2.Length()/dz0 ));
      
    const ON_Xform x3(ON_Xform::TranslationTransformation( d0[0],d1[0],d2[0]));


    cage_xform = x3*(x2*x1);
    rc = true;
  }
  return rc;
}